

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

thousands_sep_result<char> *
fmt::v9::detail::thousands_sep_impl<char>
          (thousands_sep_result<char> *__return_storage_ptr__,locale_ref loc)

{
  bool bVar1;
  numpunct *pnVar2;
  char local_81;
  undefined1 local_58 [7];
  char thousands_sep;
  string grouping;
  locale local_28;
  numpunct *local_20;
  numpunct<char> *facet;
  locale_ref loc_local;
  
  facet = (numpunct<char> *)loc.locale_;
  loc_local.locale_ = __return_storage_ptr__;
  locale_ref::get<std::locale>((locale_ref *)&local_28);
  pnVar2 = std::use_facet<std::__cxx11::numpunct<char>>(&local_28);
  std::locale::~locale((locale *)&local_28);
  local_20 = pnVar2;
  std::__cxx11::numpunct<char>::grouping();
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  if (bVar1) {
    local_81 = '\0';
  }
  else {
    local_81 = std::__cxx11::numpunct<char>::thousands_sep();
  }
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  __return_storage_ptr__->thousands_sep = local_81;
  std::__cxx11::string::~string((string *)local_58);
  return __return_storage_ptr__;
}

Assistant:

FMT_FUNC auto thousands_sep_impl(locale_ref loc) -> thousands_sep_result<Char> {
  auto& facet = std::use_facet<std::numpunct<Char>>(loc.get<std::locale>());
  auto grouping = facet.grouping();
  auto thousands_sep = grouping.empty() ? Char() : facet.thousands_sep();
  return {std::move(grouping), thousands_sep};
}